

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cc
# Opt level: O0

string * leveldb::MakeFileName
                   (string *__return_storage_ptr__,string *dbname,uint64_t number,char *suffix)

{
  char local_98 [8];
  char buf [100];
  char *suffix_local;
  uint64_t number_local;
  string *dbname_local;
  
  snprintf(local_98,100,"/%06llu.%s",number,suffix);
  std::operator+(__return_storage_ptr__,dbname,local_98);
  return __return_storage_ptr__;
}

Assistant:

static std::string MakeFileName(const std::string& dbname, uint64_t number,
                                const char* suffix) {
  char buf[100];
  std::snprintf(buf, sizeof(buf), "/%06llu.%s",
                static_cast<unsigned long long>(number), suffix);
  return dbname + buf;
}